

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

Frame * rw::cloneRecurse(Frame *old,Frame *newroot)

{
  Frame *old_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  Frame *this;
  Frame *pFVar12;
  EVP_PKEY_CTX *src;
  Frame **ppFVar13;
  
  this = Frame::create();
  if (newroot == (Frame *)0x0) {
    newroot = this;
  }
  Object::copy(&this->object,(EVP_PKEY_CTX *)old,src);
  fVar10 = (old->matrix).right.x;
  fVar11 = (old->matrix).right.y;
  uVar1 = *(undefined8 *)&(old->matrix).right.z;
  fVar8 = (old->matrix).up.x;
  fVar9 = (old->matrix).up.y;
  uVar2 = *(undefined8 *)&(old->matrix).up.z;
  fVar6 = (old->matrix).at.x;
  fVar7 = (old->matrix).at.y;
  uVar3 = *(undefined8 *)&(old->matrix).at.z;
  fVar5 = (old->matrix).pos.y;
  uVar4 = *(undefined8 *)&(old->matrix).pos.z;
  (this->matrix).pos.x = (old->matrix).pos.x;
  (this->matrix).pos.y = fVar5;
  *(undefined8 *)&(this->matrix).pos.z = uVar4;
  (this->matrix).at.x = fVar6;
  (this->matrix).at.y = fVar7;
  *(undefined8 *)&(this->matrix).at.z = uVar3;
  (this->matrix).up.x = fVar8;
  (this->matrix).up.y = fVar9;
  *(undefined8 *)&(this->matrix).up.z = uVar2;
  (this->matrix).right.x = fVar10;
  (this->matrix).right.y = fVar11;
  *(undefined8 *)&(this->matrix).right.z = uVar1;
  this->root = newroot;
  old->root = this;
  ppFVar13 = &old->child;
  while (old_00 = *ppFVar13, old_00 != (Frame *)0x0) {
    pFVar12 = cloneRecurse(old_00,newroot);
    pFVar12->next = this->child;
    this->child = pFVar12;
    (pFVar12->object).parent = this;
    ppFVar13 = &old_00->next;
  }
  PluginList::copy((PluginList *)&Frame::s_plglist,(EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)old);
  return this;
}

Assistant:

static Frame*
cloneRecurse(Frame *old, Frame *newroot)
{
	Frame *frame = Frame::create();
	if(newroot == nil)
		newroot = frame;
	frame->object.copy(&old->object);
	frame->matrix = old->matrix;
	frame->root = newroot;
	old->root = frame;	// Remember cloned frame
	for(Frame *child = old->child; child; child = child->next){
		Frame *clonedchild = cloneRecurse(child, newroot);
		clonedchild->next = frame->child;
		frame->child = clonedchild;
		clonedchild->object.parent = frame;
	}
	Frame::s_plglist.copy(frame, old);
	return frame;
}